

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O0

void plutovg_color_init_hsla(plutovg_color_t *color,float h,float s,float l,float a)

{
  float r_00;
  float g_00;
  float b_00;
  float b;
  float g;
  float r;
  float a_local;
  float l_local;
  float s_local;
  float h_local;
  plutovg_color_t *color_local;
  
  l_local = fmodf(h,360.0);
  if (l_local < 0.0) {
    l_local = l_local + 360.0;
  }
  r_00 = hsl_component(l_local,s,l,0.0);
  g_00 = hsl_component(l_local,s,l,8.0);
  b_00 = hsl_component(l_local,s,l,4.0);
  plutovg_color_init_rgba(color,r_00,g_00,b_00,a);
  return;
}

Assistant:

void plutovg_color_init_hsla(plutovg_color_t* color, float h, float s, float l, float a)
{
    h = fmodf(h, 360.f);
    if(h < 0.f) { h += 360.f; }

    float r = hsl_component(h, s, l, 0);
    float g = hsl_component(h, s, l, 8);
    float b = hsl_component(h, s, l, 4);
    plutovg_color_init_rgba(color, r, g, b, a);
}